

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O2

void show_usage(void)

{
  printf("Usage: test [-h] %s\nwhere %s\n%s\n%s\n%s\n",
         "[-l latency] [-r rate] [-d device] [-s dur] [-n]",
         "latency is in ms, rate is messages per second,","device is the PortMidi device number,",
         "dur is the length of the test in seconds, and",
         "-n means send timestamps in the past, -h means help.");
  return;
}

Assistant:

void show_usage()
{
    printf("Usage: test [-h] %s\nwhere %s\n%s\n%s\n%s\n",
           "[-l latency] [-r rate] [-d device] [-s dur] [-n]",
           "latency is in ms, rate is messages per second,",
           "device is the PortMidi device number,",
           "dur is the length of the test in seconds, and",
           "-n means send timestamps in the past, -h means help.");
}